

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  bool bVar7;
  __mode_t __mode;
  uv_dirent_type_t uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint *puVar14;
  ssize_t sVar15;
  size_t sVar16;
  _func_void_uv__work_ptr *p_Var17;
  dirent64 *dent;
  char *pcVar18;
  _func_void_uv__work_ptr *p_Var19;
  ulong uVar20;
  DIR *pDVar21;
  size_t sVar22;
  size_t sVar23;
  uv_loop_s *puVar24;
  _func_void_uv__work_ptr_int *p_Var25;
  long lVar26;
  ulong uVar27;
  _func_void_uv__work_ptr_int *p_Var28;
  iovec *iov;
  code *pcVar29;
  uint uVar30;
  _func_void_uv__work_ptr_int *p_Var31;
  long lVar32;
  size_t sVar33;
  pollfd pfd;
  stat dst_statsbuf;
  stat pbuf;
  stat64 local_21d0;
  stat64 local_2140;
  statfs64 local_20b0;
  undefined1 local_2038 [16];
  void *local_2028;
  undefined8 uStack_2020;
  __gid_t _Stack_2018;
  int iStack_2014;
  uv_loop_s *puStack_2010;
  void *local_2008;
  __fsid_t _Stack_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *p_Stack_1fc8;
  char *local_1f28;
  uint local_1f20;
  uint local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar14 = (uint *)__errno_location();
  buf = &w[-6].loop;
LAB_0017ff45:
  *puVar14 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    iVar9 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                   (ulong)*(uint *)(w[-2].wq + 1));
    break;
  case 2:
    iVar9 = uv__close_nocancel(*(int *)w[-2].wq);
    if (iVar9 == -1) {
      iVar9 = -(uint)(*puVar14 != 0x73 && *puVar14 != 4);
    }
    break;
  case 3:
    uVar12 = uv__getiovmax();
    uVar30 = *(uint *)((long)w[-2].wq + 0xc);
    if (uVar12 < uVar30) {
      *(uint *)((long)w[-2].wq + 0xc) = uVar12;
      uVar30 = uVar12;
    }
    p_Var28 = w[-1].done;
    if ((long)p_Var28 < 0) {
      piVar2 = (iovec *)w[-1].work;
      if (uVar30 == 1) {
        p_Var31 = (_func_void_uv__work_ptr_int *)
                  read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
      }
      else {
        p_Var31 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar30);
      }
    }
    else if (uVar30 == 1) {
      p_Var31 = (_func_void_uv__work_ptr_int *)
                pread64(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                        (__off64_t)p_Var28);
    }
    else {
      if (uv__fs_read_no_preadv != '\x01') {
        p_Var31 = (_func_void_uv__work_ptr_int *)
                  uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar30,(int64_t)p_Var28);
        if ((p_Var31 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
           (p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar14 != 0x26))
        goto LAB_00180da8;
        uv__fs_read_no_preadv = '\x01';
        uVar30 = *(uint *)((long)w[-2].wq + 0xc);
        p_Var28 = w[-1].done;
      }
      if (uVar30 == 0) {
        __assert_fail("nbufs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/fs.c"
                      ,0x184,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
      }
      iVar9 = *(int *)w[-2].wq;
      p_Var19 = w[-1].work;
      p_Var17 = p_Var19 + (ulong)uVar30 * 0x10;
      p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
      do {
        uVar20 = 0;
        do {
          while( true ) {
            sVar15 = pread64(iVar9,(void *)(*(long *)p_Var19 + uVar20),
                             *(long *)(p_Var19 + 8) - uVar20,(__off64_t)(p_Var28 + (long)p_Var31));
            if (sVar15 != -1) break;
            if ((long)(int)*puVar14 != 4) {
              if (p_Var31 == (_func_void_uv__work_ptr_int *)0x0) {
                p_Var31 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar14;
              }
              goto LAB_00180da8;
            }
          }
          if (sVar15 == 0) goto LAB_00180da8;
          uVar20 = uVar20 + sVar15;
          p_Var31 = p_Var31 + sVar15;
        } while (uVar20 < *(ulong *)(p_Var19 + 8));
        p_Var19 = p_Var19 + 0x10;
      } while (p_Var19 != p_Var17);
    }
LAB_00180da8:
    if ((uv__work *)w[-1].work != w + 1) {
      uv__free((uv__work *)w[-1].work);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_00180950;
  case 4:
    uVar12 = uv__getiovmax();
    uVar30 = *(uint *)((long)w[-2].wq + 0xc);
    ptr = (uv__work *)w[-1].work;
    if (uVar30 != 0) {
      p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00180206:
      uVar11 = uVar12;
      if (uVar30 < uVar12) {
        uVar11 = uVar30;
      }
      *(uint *)((long)w[-2].wq + 0xc) = uVar11;
      do {
        p_Var28 = w[-1].done;
        if ((long)p_Var28 < 0) {
          piVar2 = (iovec *)w[-1].work;
          if (uVar11 == 1) {
            p_Var28 = (_func_void_uv__work_ptr_int *)
                      write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
          }
          else {
            p_Var28 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar11);
          }
LAB_00180274:
          if (-1 < (long)p_Var28) goto LAB_001802b5;
          uVar11 = *puVar14;
        }
        else {
          iov = (iovec *)w[-1].work;
          if ((uVar11 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_0018022e:
            p_Var28 = (_func_void_uv__work_ptr_int *)
                      pwrite64(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off64_t)p_Var28);
            goto LAB_00180274;
          }
          p_Var28 = (_func_void_uv__work_ptr_int *)
                    uv__pwritev(*(int *)w[-2].wq,iov,uVar11,(int64_t)p_Var28);
          if (p_Var28 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_00180274;
          uVar11 = *puVar14;
          p_Var28 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          if (uVar11 == 0x26) {
            uv__fs_write_no_pwritev = '\x01';
            iov = (iovec *)w[-1].work;
            p_Var28 = w[-1].done;
            goto LAB_0018022e;
          }
        }
        if (uVar11 != 4) goto LAB_00181087;
        uVar11 = *(uint *)((long)w[-2].wq + 0xc);
      } while( true );
    }
    p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0018108e:
    if (ptr != w + 1) {
      uv__free(ptr);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_00180950;
  case 5:
    local_2140.st_dev = (__dev_t)w[-1].done;
    sVar15 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)&local_2140,
                        (size_t)w[1].done);
    p_Var28 = w[-1].done;
    if (((_func_void_uv__work_ptr_int *)(local_2140.st_dev + -(long)p_Var28) ==
         (_func_void_uv__work_ptr_int *)0x0 || (long)local_2140.st_dev < (long)p_Var28) &&
        sVar15 == -1) {
      uVar30 = *puVar14;
      if (((uVar30 < 0x17) && ((0x440020U >> (uVar30 & 0x1f) & 1) != 0)) ||
         (p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar30 == 0x58)) {
        *puVar14 = 0;
        p_Var31 = w[1].done;
        if (p_Var31 != (_func_void_uv__work_ptr_int *)0x0) {
          iVar9 = *(int *)w[-2].wq;
          iVar13 = *(int *)((long)w[-2].wq + 4);
          bVar7 = true;
          p_Var25 = (_func_void_uv__work_ptr_int *)0x0;
LAB_001809dd:
          do {
            sVar22 = (long)p_Var31 - (long)p_Var25;
            if (0x1fff < sVar22) {
              sVar22 = 0x2000;
            }
LAB_001809f4:
            if (bVar7) {
              sVar23 = pread64(iVar13,local_2038,sVar22,(__off64_t)p_Var28);
            }
            else {
              sVar23 = read(iVar13,local_2038,sVar22);
            }
            if (sVar23 == 0xffffffffffffffff) goto code_r0x00180a1e;
            if (sVar23 == 0) goto LAB_00180ebc;
            if (0 < (long)sVar23) {
              lVar26 = 0;
              sVar22 = sVar23;
              do {
                while( true ) {
                  sVar15 = write(iVar9,local_2038 + lVar26,sVar22);
                  if (sVar15 != -1) break;
                  if (*puVar14 != 4) {
                    if (*puVar14 != 0xb) goto LAB_0018115b;
                    local_21d0.st_dev._4_2_ = 4;
                    local_21d0.st_dev._6_2_ = 0;
                    local_21d0.st_dev._0_4_ = iVar9;
                    while( true ) {
                      iVar10 = poll((pollfd *)&local_21d0,1,-1);
                      if (iVar10 != -1) break;
                      if (*puVar14 != 4) goto LAB_00180f39;
                    }
                    if ((local_21d0.st_dev._6_2_ & 0xfffb) != 0) {
LAB_00180f39:
                      *puVar14 = 5;
                      p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                      goto LAB_00180950;
                    }
                  }
                }
                lVar26 = lVar26 + sVar15;
                sVar22 = sVar23 - lVar26;
              } while (sVar22 != 0 && lVar26 <= (long)sVar23);
            }
            p_Var28 = p_Var28 + sVar23;
            p_Var25 = p_Var25 + sVar23;
            if (p_Var31 <= p_Var25) {
LAB_00180ebc:
              if (p_Var25 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_00180ecb;
              p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
              goto LAB_00180950;
            }
          } while( true );
        }
        p_Var25 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00180ecb:
        w[-1].done = p_Var28;
        p_Var31 = p_Var25;
      }
    }
    else {
      w[-1].done = (_func_void_uv__work_ptr_int *)local_2140.st_dev;
      p_Var31 = (_func_void_uv__work_ptr_int *)(local_2140.st_dev + -(long)p_Var28);
    }
    goto LAB_00180950;
  case 6:
    p_Var31 = w[-6].done;
    iVar9 = uv__fs_statx(-1,(char *)p_Var31,0,0,(uv_stat_t *)buf);
    if (iVar9 == -0x26) {
      iVar9 = stat64((char *)p_Var31,(stat64 *)local_2038);
LAB_0018065e:
      if (iVar9 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)uStack_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        auVar5._8_4_ = _Stack_2018;
        auVar5._0_8_ = (ulong)uStack_2020 >> 0x20;
        auVar5._12_4_ = 0;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)uStack_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)auVar5._8_8_;
        w[-5].loop = puStack_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)_Stack_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-2].work = local_1fd0;
        w[-2].done = p_Stack_1fc8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = p_Stack_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
        iVar9 = 0;
      }
    }
    break;
  case 7:
    p_Var31 = w[-6].done;
    iVar9 = uv__fs_statx(-1,(char *)p_Var31,0,1,(uv_stat_t *)buf);
    if (iVar9 == -0x26) {
      iVar9 = lstat64((char *)p_Var31,(stat64 *)local_2038);
      goto LAB_0018065e;
    }
    break;
  case 8:
    iVar13 = *(int *)w[-2].wq;
    iVar9 = uv__fs_statx(iVar13,"",1,0,(uv_stat_t *)buf);
    if (iVar9 == -0x26) {
      iVar9 = fstat64(iVar13,(stat64 *)local_2038);
      if (iVar9 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)uStack_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        auVar4._8_4_ = _Stack_2018;
        auVar4._0_8_ = (ulong)uStack_2020 >> 0x20;
        auVar4._12_4_ = 0;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)uStack_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)auVar4._8_8_;
        w[-5].loop = puStack_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)_Stack_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-2].work = local_1fd0;
        w[-2].done = p_Stack_1fc8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = p_Stack_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
        iVar9 = 0;
      }
    }
    break;
  case 9:
    iVar9 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
    break;
  case 10:
    local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
    dVar6 = (double)w[-1].wq[0] * 1000000.0;
    uVar20 = (ulong)dVar6;
    local_2038._8_8_ =
         (((long)(dVar6 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) % 1000000) * 1000;
    local_2028 = (void *)(long)(double)w[-1].wq[1];
    dVar6 = (double)w[-1].wq[1] * 1000000.0;
    uVar20 = (ulong)dVar6;
    uStack_2020 = (void *)((((long)(dVar6 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20)
                           % 1000000) * 1000);
    iVar9 = utimensat(-100,(char *)w[-6].done,(timespec *)local_2038,0);
    break;
  case 0xb:
    local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
    dVar6 = (double)w[-1].wq[0] * 1000000.0;
    uVar20 = (ulong)dVar6;
    local_2038._8_8_ =
         (((long)(dVar6 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) % 1000000) * 1000;
    local_2028 = (void *)(long)(double)w[-1].wq[1];
    dVar6 = (double)w[-1].wq[1] * 1000000.0;
    uVar20 = (ulong)dVar6;
    uStack_2020 = (void *)((((long)(dVar6 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20)
                           % 1000000) * 1000);
    iVar9 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
    break;
  case 0xc:
    iVar9 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    iVar9 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    iVar9 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    iVar9 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    iVar9 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    iVar9 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    iVar9 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    iVar9 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar18 = mkdtemp((char *)w[-6].done);
    p_Var31 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar18 == (char *)0x0);
    goto LAB_00180950;
  case 0x15:
    iVar9 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    local_2038._0_8_ = (uv_loop_s *)0x0;
    iVar9 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                      uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (iVar9 != -1) {
      puVar24 = (uv_loop_s *)local_2038._0_8_;
      if (iVar9 == 0) {
        free((void *)local_2038._0_8_);
        puVar24 = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)puVar24;
      goto LAB_00180ba7;
    }
    p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_00180950;
  case 0x17:
    iVar9 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    iVar9 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar16 = pathconf((char *)w[-6].done,4);
    sVar33 = 0x100;
    if (sVar16 != 0xffffffffffffffff) {
      sVar33 = sVar16;
    }
    p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(sVar33);
    if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
      *puVar14 = 0xc;
    }
    else {
      sVar16 = readlink((char *)w[-6].done,(char *)p_Var17,sVar33);
      if (sVar16 != 0xffffffffffffffff) {
        p_Var19 = p_Var17;
        if (sVar16 == sVar33) {
          p_Var19 = (_func_void_uv__work_ptr *)uv__realloc(p_Var17,sVar33 + 1);
          sVar16 = sVar33;
          if (p_Var19 == (_func_void_uv__work_ptr *)0x0) goto LAB_00180191;
        }
        p_Var19[sVar16] = (_func_void_uv__work_ptr)0x0;
        goto LAB_001811e9;
      }
LAB_00180191:
      uv__free(p_Var17);
    }
    goto LAB_0018095a;
  case 0x1a:
    iVar9 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    iVar9 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    p_Var19 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
    if (p_Var19 != (_func_void_uv__work_ptr *)0x0) goto LAB_001811e9;
    goto LAB_0018095a;
  case 0x1d:
    uVar30 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0)
    ;
    uv_fs_req_cleanup((uv_fs_t *)local_2038);
    if ((int)uVar30 < 0) {
      p_Var31 = (_func_void_uv__work_ptr_int *)(long)(int)uVar30;
    }
    else {
      iVar9 = fstat64(uVar30,&local_21d0);
      __mode = local_21d0.st_mode;
      if (iVar9 == 0) {
        uVar11 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                            (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_21d0.st_mode,
                            (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        uVar12 = uVar11;
        if (-1 < (int)uVar11) {
          iVar9 = fstat64(uVar11,&local_2140);
          if (iVar9 != 0) {
            p_Var31 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar14;
LAB_00180d05:
            uVar12 = (uint)p_Var31;
            goto LAB_00180d0a;
          }
          if (((_func_void_uv__work_ptr_int *)
               CONCAT26(local_21d0.st_dev._6_2_,
                        CONCAT24(local_21d0.st_dev._4_2_,(int)local_21d0.st_dev)) ==
               (_func_void_uv__work_ptr_int *)local_2140.st_dev) &&
             (local_21d0.st_ino == local_2140.st_ino)) {
            uVar12 = 0;
          }
          else {
            iVar9 = fchmod(uVar11,__mode);
            if (iVar9 == -1) {
              if (*puVar14 != 1) {
                p_Var31 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar14;
                goto LAB_00180d05;
              }
              iVar9 = fstatfs64(uVar11,&local_20b0);
              uVar12 = 0xffffffff;
              if ((iVar9 == -1) || (uVar12 = 0xffffffff, local_20b0.f_type != 0xff534d42))
              goto LAB_00180d19;
            }
            if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
              iVar9 = ioctl(uVar11,0x40049409,(ulong)uVar30);
              uVar12 = 0;
              if (iVar9 == 0) goto LAB_00180d19;
              if (((ulong)w[-2].wq[0] & 0x400000000) != 0) {
                uVar12 = -*puVar14;
                goto LAB_00180d0a;
              }
            }
            if (local_21d0.st_size == 0) {
              uVar12 = 0;
            }
            else {
              p_Var28 = (_func_void_uv__work_ptr_int *)0x0;
              sVar33 = local_21d0.st_size;
              do {
                local_2038._8_4_ = 6;
                local_1ff8 = UV_FS_SENDFILE;
                local_1f28 = (char *)0x0;
                local_1f10 = (uv_buf_t *)0x0;
                local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                puStack_1fd8 = (uv_loop_s *)0x0;
                local_1ff0 = (uv_loop_t *)0x0;
                p_Stack_1fe8 = (uv_fs_cb)0x0;
                local_1f20 = uVar11;
                local_1f1c = uVar30;
                local_1f08 = p_Var28;
                local_1eb8 = sVar33;
                uv__fs_work(&local_1ee8);
                p_Var31 = local_1fe0;
                uv_fs_req_cleanup((uv_fs_t *)local_2038);
                if ((long)p_Var31 < 0) goto LAB_00180d05;
                p_Var28 = p_Var28 + (long)p_Var31;
                sVar33 = sVar33 - (long)p_Var31;
                uVar12 = 0;
              } while (sVar33 != 0);
            }
          }
        }
      }
      else {
        uVar12 = -*puVar14;
        uVar11 = 0xffffffff;
LAB_00180d0a:
        uVar12 = (int)uVar12 >> 0x1f & uVar12;
      }
LAB_00180d19:
      uVar30 = uv__close_nocheckstdio(uVar30);
      if (uVar30 == 0) {
        uVar30 = uVar12;
      }
      if (uVar12 != 0) {
        uVar30 = uVar12;
      }
      if ((int)uVar11 < 0) {
        if (uVar30 == 0) goto LAB_00180d98;
      }
      else {
        uVar12 = uv__close_nocheckstdio(uVar11);
        if (uVar12 == 0) {
          uVar12 = uVar30;
        }
        if (uVar30 == 0) {
          uVar30 = uVar12;
        }
        if (uVar30 == 0) {
LAB_00180d98:
          p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
          goto LAB_00180950;
        }
        uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
      }
      *puVar14 = -uVar30;
      p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    }
    goto LAB_00180950;
  case 0x1e:
    iVar9 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1f:
    p_Var19 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
    if (p_Var19 == (_func_void_uv__work_ptr *)0x0) {
LAB_00180975:
      uv__free(p_Var19);
      p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      p_Var19 = (_func_void_uv__work_ptr *)0x0;
    }
    else {
      pDVar21 = opendir((char *)w[-6].done);
      *(DIR **)(p_Var19 + 0x30) = pDVar21;
      if (pDVar21 == (DIR *)0x0) goto LAB_00180975;
      p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
    }
    w[-6].work = p_Var19;
    goto LAB_00180950;
  case 0x20:
    p_Var19 = w[-6].work;
    if (*(long *)(p_Var19 + 8) != 0) {
      uVar27 = 0;
      uVar20 = 0;
LAB_00180458:
      do {
        *puVar14 = 0;
        dent = readdir64(*(DIR **)(p_Var19 + 0x30));
        uVar30 = (uint)uVar20;
        if (dent == (dirent64 *)0x0) {
          if (*puVar14 != 0) {
LAB_00180c59:
            if (uVar30 != 0) {
              lVar26 = *(long *)p_Var19;
              lVar32 = 0;
              do {
                uv__free(*(void **)(lVar26 + lVar32));
                lVar26 = *(long *)p_Var19;
                *(undefined8 *)(lVar26 + lVar32) = 0;
                lVar32 = lVar32 + 0x10;
              } while (uVar20 << 4 != lVar32);
            }
            uVar30 = 0xffffffff;
          }
          break;
        }
        if ((dent->d_name[0] == '.') &&
           ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0'))))))
        goto LAB_00180494;
        lVar26 = *(long *)p_Var19;
        pcVar18 = uv__strdup(dent->d_name);
        *(char **)(lVar26 + uVar27 * 0x10) = pcVar18;
        if (pcVar18 == (char *)0x0) goto LAB_00180c59;
        uVar8 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar26 + uVar27 * 0x10 + 8) = uVar8;
        uVar30 = uVar30 + 1;
        uVar27 = (ulong)uVar30;
        uVar20 = uVar27;
      } while (uVar27 < *(ulong *)(p_Var19 + 8));
      goto LAB_00180c95;
    }
    uVar30 = 0;
LAB_00180c95:
    p_Var31 = (_func_void_uv__work_ptr_int *)(long)(int)uVar30;
    goto LAB_00180950;
  case 0x21:
    p_Var19 = w[-6].work;
    if (*(DIR **)(p_Var19 + 0x30) != (DIR *)0x0) {
      closedir(*(DIR **)(p_Var19 + 0x30));
      *(undefined8 *)(p_Var19 + 0x30) = 0;
      p_Var19 = w[-6].work;
    }
    uv__free(p_Var19);
    p_Var19 = (_func_void_uv__work_ptr *)0x0;
LAB_001811e9:
    w[-6].work = p_Var19;
    w[-7].wq[1] = (void *)0x0;
    goto LAB_0018117f;
  case 0x22:
    iVar9 = statfs64((char *)w[-6].done,(statfs64 *)local_2038);
    p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (iVar9 == 0) {
      p_Var19 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
      if (p_Var19 == (_func_void_uv__work_ptr *)0x0) {
        *puVar14 = 0xc;
      }
      else {
        *(undefined8 *)p_Var19 = local_2038._0_8_;
        *(undefined8 *)(p_Var19 + 8) = local_2038._8_8_;
        *(void **)(p_Var19 + 0x10) = local_2028;
        *(void **)(p_Var19 + 0x18) = uStack_2020;
        *(long *)(p_Var19 + 0x20) = CONCAT44(iStack_2014,_Stack_2018);
        *(uv_loop_s **)(p_Var19 + 0x28) = puStack_2010;
        *(void **)(p_Var19 + 0x30) = local_2008;
        w[-6].work = p_Var19;
        p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
      }
    }
    goto LAB_00180950;
  case 0x23:
    p_Var31 = w[-6].done;
    sVar22 = strlen((char *)p_Var31);
    if (5 < sVar22) {
      iVar9 = strcmp((char *)(p_Var31 + (sVar22 - 6)),"XXXXXX");
      if (iVar9 == 0) {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 &&
            (uv__fs_mkstemp_no_cloexec_support & 1) == 0) {
          iVar9 = (*uv__mkostemp)((char *)p_Var31,0x80000);
          if ((-1 < iVar9) || (*puVar14 != 0x16)) goto LAB_00180ba7;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar9 = mkstemp64((char *)p_Var31);
        if (-1 < iVar9) {
          iVar13 = uv__cloexec_ioctl(iVar9,1);
          if (iVar13 != 0) {
            iVar13 = uv__close(iVar9);
            iVar9 = -1;
            if (iVar13 != 0) {
switchD_0017ff6b_default:
              abort();
            }
          }
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
        goto LAB_00180ba7;
      }
    }
    *puVar14 = 0x16;
    iVar9 = -1;
LAB_00180ba7:
    p_Var31 = (_func_void_uv__work_ptr_int *)(long)iVar9;
    goto LAB_00180950;
  default:
    goto switchD_0017ff6b_default;
  }
  p_Var31 = (_func_void_uv__work_ptr_int *)(long)iVar9;
  goto LAB_00180950;
LAB_00180494:
  if (*(ulong *)(p_Var19 + 8) <= uVar27) goto LAB_00180c95;
  goto LAB_00180458;
code_r0x00180a1e:
  uVar30 = *puVar14;
  if (uVar30 != 4) goto code_r0x00180a2a;
  goto LAB_001809f4;
code_r0x00180a2a:
  if ((!bVar7) || (p_Var25 != (_func_void_uv__work_ptr_int *)0x0)) {
    p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (p_Var25 + 1 < (code *)0x2) goto LAB_00180950;
    goto LAB_00180ecb;
  }
  bVar7 = false;
  p_Var25 = (_func_void_uv__work_ptr_int *)0x0;
  if ((uVar30 == 5) || (p_Var25 = (_func_void_uv__work_ptr_int *)0x0, uVar30 == 0x1d))
  goto LAB_001809dd;
LAB_0018115b:
  p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
LAB_00180950:
  if (p_Var31 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
    w[-7].wq[1] = p_Var31;
    if (p_Var31 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_0018117f:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)buf;
    return;
  }
LAB_0018095a:
  if ((0xfffffffd < iVar1 - 4U) || (*puVar14 != 4)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar14;
    return;
  }
  goto LAB_0017ff45;
LAB_001802b5:
  if (p_Var28 == (_func_void_uv__work_ptr_int *)0x0) {
    p_Var28 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00181087:
    if (p_Var31 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var31 = p_Var28;
    }
    goto LAB_0018108e;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_Var28;
  }
  p_Var19 = w[-1].work;
  pcVar29 = p_Var19 + 8;
  uVar11 = 0;
  p_Var25 = p_Var28;
  do {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar29;
    if (p_Var25 <= p_Var3 && (long)p_Var3 - (long)p_Var25 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar29 + -8) = p_Var25 + *(ulong *)(pcVar29 + -8);
      *(long *)pcVar29 = (long)p_Var3 - (long)p_Var25;
      break;
    }
    uVar11 = uVar11 + 1;
    pcVar29 = pcVar29 + 0x10;
    p_Var25 = p_Var25 + -(long)p_Var3;
  } while (p_Var25 != (_func_void_uv__work_ptr_int *)0x0);
  *(uint *)((long)w[-2].wq + 0xc) = uVar11;
  w[-1].work = p_Var19 + (ulong)uVar11 * 0x10;
  p_Var31 = p_Var31 + (long)p_Var28;
  uVar30 = uVar30 - uVar11;
  if (uVar30 == 0) goto LAB_0018108e;
  goto LAB_00180206;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}